

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O1

string * __thiscall pbrt::Timer::ToString_abi_cxx11_(string *__return_storage_ptr__,Timer *this)

{
  time_point local_20;
  
  local_20.__d.__r = (duration)(this->start).__d.__r;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<long>
            (__return_storage_ptr__,"[ Timer start(ns): %d ]",(long *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string Timer::ToString() const {
    return StringPrintf(
        "[ Timer start(ns): %d ]",
        std::chrono::duration_cast<std::chrono::nanoseconds>(start.time_since_epoch())
            .count());
}